

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::SweepBucket
          (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this,
          RecyclerSweep *recyclerSweep)

{
  undefined4 *puVar1;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *heapBlockList;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *heapBlockList_00;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  RecyclerSweepManager *this_00;
  FreeObject *pFVar5;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar6;
  SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this_01;
  undefined8 *in_FS_OFFSET;
  
  bVar3 = RecyclerSweep::IsBackground(recyclerSweep);
  SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
  GetNonEmptyHeapBlockCount
            ((SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
              *)this,true);
  if (!bVar3) {
    GetEmptyHeapBlockCount(this);
  }
  this_00 = RecyclerSweep::GetManager(recyclerSweep);
  bVar3 = RecyclerSweepManager::HasSetupBackgroundSweep(this_00);
  if (bVar3) {
    bVar3 = IsAllocationStopped(this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x4fd,"(IsAllocationStopped())","IsAllocationStopped()");
      if (!bVar3) goto LAB_0022441d;
      *puVar1 = 0;
    }
    uVar4 = HeapInfo::GetMediumBucketIndex((ulong)(this->super_HeapBucket).sizeCat);
    pSVar6 = &((recyclerSweep->mediumNormalData).bucketData[uVar4].savedNextAllocableBlockHead)->
              super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
  }
  else {
    this_01 = &this->allocatorHead;
    do {
      if ((this_01->heapBlock != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) ||
         (pFVar5 = SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                   ::GetExplicitFreeList(this_01), pFVar5 != (FreeObject *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                           ,0x503,"(AllocatorsAreEmpty())","AllocatorsAreEmpty()");
        if (!bVar3) goto LAB_0022441d;
        *puVar1 = 0;
        break;
      }
      this_01 = this_01->next;
    } while (this_01 != &this->allocatorHead);
    pSVar6 = &this->nextAllocableBlockHead->super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
    StopAllocationBeforeSweep(this);
  }
  uVar4 = HeapInfo::GetMediumBucketIndex((ulong)(this->super_HeapBucket).sizeCat);
  if ((recyclerSweep->mediumNormalData).bucketData[uVar4].pendingSweepList !=
      (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x50a,"(recyclerSweep.GetPendingSweepBlockList(this) == nullptr)",
                       "recyclerSweep.GetPendingSweepBlockList(this) == nullptr");
    if (!bVar3) goto LAB_0022441d;
    *puVar1 = 0;
  }
  (recyclerSweep->super_RecyclerVerifyListConsistencyData).mediumBlockVerifyListConsistencyData.
  nextAllocableBlockHead = pSVar6;
  (recyclerSweep->super_RecyclerVerifyListConsistencyData).mediumBlockVerifyListConsistencyData.
  expectFull = true;
  (recyclerSweep->super_RecyclerVerifyListConsistencyData).mediumBlockVerifyListConsistencyData.
  expectDispose = false;
  (recyclerSweep->super_RecyclerVerifyListConsistencyData).mediumBlockVerifyListConsistencyData.
  hasSetupVerifyListConsistencyData = true;
  heapBlockList = this->fullBlockList;
  heapBlockList_00 = this->heapBlockList;
  this->fullBlockList = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  this->heapBlockList = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  SweepHeapBlockList(this,recyclerSweep,heapBlockList_00,true);
  (recyclerSweep->super_RecyclerVerifyListConsistencyData).mediumBlockVerifyListConsistencyData.
  nextAllocableBlockHead = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  (recyclerSweep->super_RecyclerVerifyListConsistencyData).mediumBlockVerifyListConsistencyData.
  expectFull = true;
  (recyclerSweep->super_RecyclerVerifyListConsistencyData).mediumBlockVerifyListConsistencyData.
  expectDispose = false;
  (recyclerSweep->super_RecyclerVerifyListConsistencyData).mediumBlockVerifyListConsistencyData.
  hasSetupVerifyListConsistencyData = true;
  SweepHeapBlockList(this,recyclerSweep,heapBlockList,false);
  if (this->nextAllocableBlockHead != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x55e,"(this->nextAllocableBlockHead == nullptr)",
                       "this->nextAllocableBlockHead == nullptr");
    if (!bVar3) {
LAB_0022441d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::SweepBucket(RecyclerSweep& recyclerSweep)
{
    DebugOnly(TBlockType * savedNextAllocableBlockHead);
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));
#if ENABLE_CONCURRENT_GC
    if (recyclerSweep.GetManager()->HasSetupBackgroundSweep())
    {
        // SetupBackgroundSweep set nextAllocableBlockHead to null already
        Assert(IsAllocationStopped());
        DebugOnly(savedNextAllocableBlockHead = recyclerSweep.GetSavedNextAllocableBlockHead(this));
    }
    else
#endif
    {
        Assert(AllocatorsAreEmpty());
        DebugOnly(savedNextAllocableBlockHead = this->nextAllocableBlockHead);
        this->StopAllocationBeforeSweep();
    }

    // We just started sweeping.  These pending lists should be empty
#if ENABLE_CONCURRENT_GC
    Assert(recyclerSweep.GetPendingSweepBlockList(this) == nullptr);
#else
    Assert(!recyclerSweep.IsBackground());
#endif

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && this->sweepableHeapBlockList != nullptr)
    {
        Assert(!this->IsAnyFinalizableBucket());

#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        // This lock is needed only in the debug mode while we verify block counts. Not needed otherwise, as this list is never accessed concurrently.
        // Items are added to it by the allocator when allocations are allowed during concurrent sweep. The list is drained during the next sweep while
        // allocation are stopped.
        debugSweepableHeapBlockListLock.Enter();
#endif
        // Return the blocks we may have allocated from during the previous concurrent sweep back to the fullBlockList.
        // We need to rebuild the free bit vectors for these blocks.
        HeapBlockList::ForEachEditing(this->sweepableHeapBlockList, [this](TBlockType * heapBlock)
        {
            heapBlock->BuildFreeBitVector();

            AssertMsg(!HeapBlockList::Contains(heapBlock, heapBlockList), "The heap block already exists in the heapBlockList.");
            AssertMsg(!HeapBlockList::Contains(heapBlock, fullBlockList), "The heap block already exists in the fullBlockList.");
            AssertMsg(!HeapBlockList::Contains(heapBlock, emptyBlockList), "The heap block already exists in the emptyBlockList.");

            heapBlock->SetNextBlock(this->fullBlockList);
            this->fullBlockList = heapBlock;
        });
        this->sweepableHeapBlockList = nullptr;
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        debugSweepableHeapBlockListLock.Leave();
#endif
    }
#endif

#if DBG
    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerSweep.SetupVerifyListConsistencyDataForSmallBlock((SmallHeapBlock*) savedNextAllocableBlockHead, true, false);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerSweep.SetupVerifyListConsistencyDataForMediumBlock((MediumHeapBlock*) savedNextAllocableBlockHead, true, false);
    }
    else
    {
        Assert(false);
    }
#endif

    // Move the list locally.  We will relink them during sweep
    TBlockType * currentFullBlockList = fullBlockList;
    TBlockType * currentHeapBlockList = heapBlockList;
    this->heapBlockList = nullptr;
    this->fullBlockList = nullptr;

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    // In order to allow allocations during sweep (Pass-1) we will set aside blocks after nextAllocableBlockHead (excluding) and allow
    // allocations to these blocks as we know that these blocks are not full yet. These will need to be swept later though before starting Pass-2
    // of the sweep.
    this->PrepareForAllocationsDuringConcurrentSweep(currentHeapBlockList);
#endif

    this->SweepHeapBlockList(recyclerSweep, currentHeapBlockList, true);

#if DBG
    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        recyclerSweep.SetupVerifyListConsistencyDataForSmallBlock(nullptr, true, false);
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        recyclerSweep.SetupVerifyListConsistencyDataForMediumBlock(nullptr, true, false);
    }
    else
    {
        Assert(false);
    }
#endif

    this->SweepHeapBlockList(recyclerSweep, currentFullBlockList, false);

    // We shouldn't have allocate from any block yet
    Assert(this->nextAllocableBlockHead == nullptr);
}